

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<VCFilter>::emplace<VCFilter_const&>
          (QGenericArrayOps<VCFilter> *this,qsizetype i,VCFilter *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  undefined8 in_RDX;
  QArrayDataPointer<VCFilter> *in_RSI;
  QArrayDataPointer<VCFilter> *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  VCFilter tmp;
  VCFilter *in_stack_fffffffffffffb28;
  undefined7 in_stack_fffffffffffffb30;
  undefined1 in_stack_fffffffffffffb37;
  undefined1 uVar5;
  undefined2 in_stack_fffffffffffffb44;
  byte bVar6;
  GrowthPosition where;
  Inserter local_4a0;
  undefined1 local_450 [1096];
  long local_8;
  
  where = (GrowthPosition)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = QArrayDataPointer<VCFilter>::needsDetach
                    ((QArrayDataPointer<VCFilter> *)
                     CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30));
  if (!(bool)uVar1) {
    if ((in_RSI == (QArrayDataPointer<VCFilter> *)in_RDI->size) &&
       (qVar3 = QArrayDataPointer<VCFilter>::freeSpaceAtEnd(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<VCFilter>::end
                ((QArrayDataPointer<VCFilter> *)
                 CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30));
      VCFilter::VCFilter((VCFilter *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                         in_stack_fffffffffffffb28);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_002aa23e;
    }
    if ((in_RSI == (QArrayDataPointer<VCFilter> *)0x0) &&
       (qVar3 = QArrayDataPointer<VCFilter>::freeSpaceAtBegin(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<VCFilter>::begin((QArrayDataPointer<VCFilter> *)0x2aa0fa);
      VCFilter::VCFilter((VCFilter *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                         in_stack_fffffffffffffb28);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_002aa23e;
    }
  }
  memset(local_450,0xaa,0x448);
  VCFilter::VCFilter((VCFilter *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                     in_stack_fffffffffffffb28);
  bVar4 = in_RDI->size != 0;
  uVar5 = bVar4 && in_RSI == (QArrayDataPointer<VCFilter> *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (QArrayDataPointer<VCFilter> *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<VCFilter>::detachAndGrow
            (in_RSI,where,CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_fffffffffffffb44,uVar2))),
             (VCFilter **)in_RDI,
             (QArrayDataPointer<VCFilter> *)CONCAT17(uVar5,in_stack_fffffffffffffb30));
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter(&local_4a0,in_RDI);
    Inserter::insertOne((Inserter *)
                        CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_fffffffffffffb44,uVar2))),
                        (qsizetype)in_RDI,(VCFilter *)CONCAT17(uVar5,in_stack_fffffffffffffb30));
    Inserter::~Inserter(&local_4a0);
  }
  else {
    QArrayDataPointer<VCFilter>::begin((QArrayDataPointer<VCFilter> *)0x2aa1c8);
    VCFilter::VCFilter((VCFilter *)CONCAT17(uVar5,in_stack_fffffffffffffb30),
                       in_stack_fffffffffffffb28);
    in_RDI->ptr = in_RDI->ptr + -1;
    in_RDI->size = in_RDI->size + 1;
  }
  VCFilter::~VCFilter((VCFilter *)CONCAT17(uVar5,in_stack_fffffffffffffb30));
LAB_002aa23e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }